

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer_type.cpp
# Opt level: O1

OptimizerType duckdb::OptimizerTypeFromString(string *str)

{
  long lVar1;
  pointer pcVar2;
  OptimizerType OVar3;
  ParserException *this;
  long lVar4;
  undefined1 *puVar5;
  long lVar6;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  optimizer_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  OVar3 = ::std::__cxx11::string::compare((char *)str);
  if (OVar3 == INVALID) {
    puVar5 = internal_optimizer_types;
    bVar7 = false;
  }
  else {
    lVar6 = 0;
    do {
      lVar4 = lVar6;
      lVar1 = *(long *)(internal_optimizer_types + lVar4 + 0x10);
      if (lVar4 + 0x10 == 0x1b0) {
        bVar7 = lVar1 == 0;
        goto LAB_00d6d6f2;
      }
      OVar3 = ::std::__cxx11::string::compare((char *)str);
      lVar6 = lVar4 + 0x10;
    } while (OVar3 != INVALID);
    bVar7 = lVar1 == 0;
    puVar5 = (undefined1 *)(lVar4 + 0x2478260);
  }
  OVar3 = *(OptimizerType *)(puVar5 + 8);
LAB_00d6d6f2:
  if (!bVar7) {
    return OVar3;
  }
  local_c8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 0;
  do {
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const*const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
               (char **)(internal_optimizer_types + lVar6));
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x1b0);
  this = (ParserException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Optimizer type \"%s\" not recognized\n%s","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + str->_M_string_length);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Candidate optimizers","");
  StringUtil::CandidatesErrorMessage(&local_50,&local_c8,str,&local_b0,5);
  ParserException::ParserException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_70,&local_90,&local_50);
  __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

OptimizerType OptimizerTypeFromString(const string &str) {
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		if (internal_optimizer_types[i].name == str) {
			return internal_optimizer_types[i].type;
		}
	}
	// optimizer not found, construct candidate list
	vector<string> optimizer_names;
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		optimizer_names.emplace_back(internal_optimizer_types[i].name);
	}
	throw ParserException("Optimizer type \"%s\" not recognized\n%s", str,
	                      StringUtil::CandidatesErrorMessage(optimizer_names, str, "Candidate optimizers"));
}